

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,SparsityPrinter>::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,SparsityPrinter>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,SparsityPrinter>
           *this)

{
  int iVar1;
  char *pcVar2;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  ArgList local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar1 = **(int **)(this + 8);
  if (0 < iVar1) {
    do {
      this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      pcVar2 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      switch(*pcVar2) {
      case '0':
        BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      case '1':
      case '2':
      case '4':
        BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        break;
      case '3':
        break;
      case '5':
        pcVar2 = "COMPL bound type is invalid for variables";
        goto LAB_0011a4d1;
      default:
        pcVar2 = "expected bound";
LAB_0011a4d1:
        uStack_40 = 0;
        local_48 = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)&local_48;
        BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)pcVar2,&local_58)
        ;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

int num_items() const { return this->reader_.header_.num_vars; }